

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

double ecs_time_measure(ecs_time_t *start)

{
  ecs_time_t in_RAX;
  ecs_time_t eVar1;
  ecs_time_t local_18;
  
  local_18 = in_RAX;
  (*ecs_os_api.get_time_)(&local_18);
  eVar1 = ecs_time_sub(local_18,*start);
  *start = local_18;
  return (double)((ulong)eVar1 >> 0x20) / 1000000000.0 + (double)((ulong)eVar1 & 0xffffffff);
}

Assistant:

double ecs_time_measure(
    ecs_time_t *start)
{
    ecs_time_t stop, temp;
    ecs_os_get_time(&stop);
    temp = stop;
    stop = ecs_time_sub(stop, *start);
    *start = temp;
    return ecs_time_to_double(stop);
}